

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_api_v2.c
# Opt level: O1

MPP_RET hal_h265ev2_init(void *hal,MppEncHalCfg *cfg)

{
  RK_U32 RVar1;
  RK_U32 RVar2;
  MPP_RET MVar3;
  undefined8 in_RAX;
  void *pvVar4;
  MppEncHalApi *pMVar5;
  undefined4 uVar6;
  
  uVar6 = (undefined4)((ulong)in_RAX >> 0x20);
  RVar1 = mpp_get_vcodec_type();
  if ((RVar1 >> 0x10 & 1) == 0) {
    pMVar5 = (MppEncHalApi *)0x0;
    _mpp_log_l(2,"hal_h265e_api_v2","vcodec type %08x can not find H.265 encoder device\n",
               (char *)0x0,(ulong)RVar1);
  }
  else {
    RVar2 = mpp_get_client_hw_id(0x10);
    if ((int)RVar2 < 0x50603313) {
      if (RVar2 == 0x50602715) {
        pMVar5 = &hal_h265e_vepu511;
      }
      else if (RVar2 == 0x50603312) {
        pMVar5 = &hal_h265e_vepu580;
      }
      else {
LAB_0024dd6e:
        pMVar5 = &hal_h265e_vepu541;
      }
    }
    else if (RVar2 == 0x506f2314) {
      pMVar5 = &hal_h265e_vepu510;
    }
    else {
      if (RVar2 != 0x50603313) goto LAB_0024dd6e;
      pMVar5 = &hal_h265e_vepu540c;
    }
  }
  if ((RVar1 >> 0x10 & 1) == 0) {
    _mpp_log_l(2,"hal_h265e_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"api",
               "hal_h265ev2_init",CONCAT44(uVar6,0x4d));
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
    if ((RVar1 >> 0x10 & 1) == 0) {
      pvVar4 = (void *)0x0;
      goto LAB_0024dcf6;
    }
  }
  pvVar4 = mpp_osal_calloc("hal_h265ev2_init",(ulong)pMVar5->ctx_size);
LAB_0024dcf6:
  *(MppEncHalApi **)hal = pMVar5;
  *(void **)((long)hal + 8) = pvVar4;
  if ((RVar1 >> 0x10 & 1) == 0) {
    return MPP_NOK;
  }
  MVar3 = (*pMVar5->init)(pvVar4,cfg);
  return MVar3;
}

Assistant:

static MPP_RET hal_h265ev2_init(void *hal, MppEncHalCfg *cfg)
{
    HalH265eV2Ctx *ctx = (HalH265eV2Ctx *)hal;
    const MppEncHalApi *api = NULL;
    void *hw_ctx = NULL;
    MPP_RET ret = MPP_OK;
    RK_U32 vcodec_type = mpp_get_vcodec_type();

    if (vcodec_type & HAVE_RKVENC) {
        RK_U32 hw_id = mpp_get_client_hw_id(VPU_CLIENT_RKVENC);

        switch (hw_id) {
        case HWID_VEPU58X : {
            api = &hal_h265e_vepu580;
        } break;
        case HWID_VEPU540C : {
            api = &hal_h265e_vepu540c;
        } break;
        case HWID_VEPU510 : {
            api = &hal_h265e_vepu510;
        } break;
        case HWID_VEPU511 : {
            api = &hal_h265e_vepu511;
        } break;
        default : {
            api = &hal_h265e_vepu541;
        } break;
        }
    } else {
        mpp_err("vcodec type %08x can not find H.265 encoder device\n",
                vcodec_type);
        ret = MPP_NOK;
    }

    mpp_assert(api);

    if (!ret)
        hw_ctx = mpp_calloc_size(void, api->ctx_size);

    ctx->api = api;
    ctx->hw_ctx = hw_ctx;

    if (ret)
        return ret;

    ret = api->init(hw_ctx, cfg);
    return ret;
}